

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

void joypad_init_file_data(JoypadBuffer *buffer,FileData *file_data)

{
  u8 *puVar1;
  JoypadBuffer *pJVar2;
  size_t __size;
  
  __size = 0;
  pJVar2 = buffer;
  while (pJVar2 = (JoypadBuffer *)(pJVar2->sentinel).next, pJVar2 != buffer) {
    __size = __size + (pJVar2->sentinel).size * 0x10;
  }
  file_data->size = __size;
  puVar1 = (u8 *)malloc(__size);
  file_data->data = puVar1;
  return;
}

Assistant:

void joypad_init_file_data(JoypadBuffer* buffer, FileData* file_data) {
  file_data->size = joypad_file_size(buffer);
  file_data->data = xmalloc(file_data->size);
}